

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateRayQueryPointer
          (ValidationState_t *_,Instruction *inst,uint32_t ray_query_index)

{
  Instruction *pIVar1;
  uint uVar2;
  Op OVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_5d0;
  Instruction *local_3f8;
  Instruction *type;
  Instruction *local_218;
  Instruction *pointer;
  Op local_34;
  Instruction *pIStack_30;
  Op var_opcode;
  Instruction *variable;
  uint32_t ray_query_id;
  uint32_t ray_query_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  variable._4_4_ = ray_query_index;
  _ray_query_id = inst;
  inst_local = (Instruction *)_;
  variable._0_4_ = val::Instruction::GetOperandAs<unsigned_int>(inst,(ulong)ray_query_index);
  pIStack_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)variable);
  local_34 = val::Instruction::opcode(pIStack_30);
  pIVar1 = inst_local;
  if ((pIStack_30 == (Instruction *)0x0) ||
     (((local_34 != OpVariable && (local_34 != OpFunctionParameter)) && (local_34 != OpAccessChain))
     )) {
    ValidationState_t::diag
              ((DiagnosticStream *)&pointer,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               _ray_query_id);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&pointer,
                        (char (*) [46])"Ray Query must be a memory object declaration");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&pointer);
  }
  else {
    uVar2 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_30,0);
    local_218 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar2);
    if ((local_218 != (Instruction *)0x0) &&
       (OVar3 = val::Instruction::opcode(local_218), pIVar1 = inst_local, OVar3 == OpTypePointer)) {
      uVar2 = val::Instruction::GetOperandAs<unsigned_int>(local_218,2);
      local_3f8 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar2);
      if ((local_3f8 != (Instruction *)0x0) &&
         (OVar3 = val::Instruction::opcode(local_3f8), OVar3 == OpTypeRayQueryKHR)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_5d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_ray_query_id);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_5d0,
                          (char (*) [49])"Ray Query must be a pointer to OpTypeRayQueryKHR");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_5d0);
      return __local._4_4_;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&type,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               _ray_query_id);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&type,(char (*) [28])"Ray Query must be a pointer");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateRayQueryPointer(ValidationState_t& _,
                                     const Instruction* inst,
                                     uint32_t ray_query_index) {
  const uint32_t ray_query_id = inst->GetOperandAs<uint32_t>(ray_query_index);
  auto variable = _.FindDef(ray_query_id);
  const auto var_opcode = variable->opcode();
  if (!variable || (var_opcode != spv::Op::OpVariable &&
                    var_opcode != spv::Op::OpFunctionParameter &&
                    var_opcode != spv::Op::OpAccessChain)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Ray Query must be a memory object declaration";
  }
  auto pointer = _.FindDef(variable->GetOperandAs<uint32_t>(0));
  if (!pointer || pointer->opcode() != spv::Op::OpTypePointer) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Ray Query must be a pointer";
  }
  auto type = _.FindDef(pointer->GetOperandAs<uint32_t>(2));
  if (!type || type->opcode() != spv::Op::OpTypeRayQueryKHR) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Ray Query must be a pointer to OpTypeRayQueryKHR";
  }
  return SPV_SUCCESS;
}